

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O3

basic_string<char> * __thiscall
frozen::bits::LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>>::
doitfirst<frozen::basic_string<char>const*,16ul>
          (LowerBound<frozen::basic_string<char>,std::less<frozen::basic_string<char>>> *this,
          long first)

{
  long lVar1;
  char cVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  basic_string<char> *it;
  basic_string<char> *pbVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  
  plVar3 = *(long **)this;
  uVar4 = *(ulong *)(first + 0x78);
  uVar5 = plVar3[1];
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    uVar10 = 0;
    uVar13 = 1;
    do {
      cVar2 = *(char *)(*(long *)(first + 0x70) + uVar10);
      if (cVar2 < *(char *)(*plVar3 + uVar10)) goto LAB_0018782b;
      if (*(char *)(*plVar3 + uVar10) < cVar2) goto LAB_00187836;
      bVar6 = uVar13 < uVar11;
      uVar10 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_0018782b:
    pbVar7 = doitfirst<frozen::basic_string<char>const*,8ul>(this,first + 0x80);
    return pbVar7;
  }
LAB_00187836:
  uVar4 = *(ulong *)(first + 0x38);
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    lVar8 = 0;
    uVar10 = 0;
    uVar13 = 1;
    do {
      cVar2 = *(char *)(*(long *)(first + 0x30) + uVar10);
      if (cVar2 < *(char *)(*plVar3 + uVar10)) goto LAB_00187876;
      if (*(char *)(*plVar3 + uVar10) < cVar2) goto LAB_0018787f;
      bVar6 = uVar13 < uVar11;
      uVar10 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_00187876:
    lVar8 = 0x40;
  }
  else {
    lVar8 = 0;
  }
LAB_0018787f:
  lVar1 = first + lVar8;
  uVar4 = *(ulong *)(first + 0x18 + lVar8);
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    lVar8 = 0;
    uVar10 = 0;
    uVar13 = 1;
    do {
      cVar2 = *(char *)(*(long *)(lVar1 + 0x10) + uVar10);
      if (cVar2 < *(char *)(*plVar3 + uVar10)) goto LAB_001878c4;
      if (*(char *)(*plVar3 + uVar10) < cVar2) goto LAB_001878cd;
      bVar6 = uVar13 < uVar11;
      uVar10 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar6);
  }
  if (uVar4 < uVar5) {
LAB_001878c4:
    lVar8 = 0x20;
  }
  else {
    lVar8 = 0;
  }
LAB_001878cd:
  uVar4 = *(ulong *)(lVar1 + 8 + lVar8);
  uVar11 = uVar5;
  if (uVar4 < uVar5) {
    uVar11 = uVar4;
  }
  if (uVar11 != 0) {
    uVar12 = 1;
    lVar9 = 0;
    uVar10 = 0;
    do {
      cVar2 = *(char *)(*(long *)(lVar1 + lVar8) + uVar10);
      if (cVar2 < *(char *)(*plVar3 + uVar10)) goto LAB_00187912;
      if (*(char *)(*plVar3 + uVar10) < cVar2) goto LAB_0018791b;
      uVar10 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar10 < uVar11);
  }
  if (uVar4 < uVar5) {
LAB_00187912:
    lVar9 = 0x10;
  }
  else {
    lVar9 = 0;
  }
LAB_0018791b:
  return (basic_string<char> *)(lVar1 + lVar8 + lVar9);
}

Assistant:

inline constexpr ForwardIt doitfirst(ForwardIt first, std::integral_constant<std::size_t, N>, std::integral_constant<bool, false>) {
    auto constexpr next_power = next_highest_power_of_two(N);
    auto constexpr next_start = next_power / 2 - 1;
    auto it = first + next_start;
    if (compare_(*it, value_)) {
      auto constexpr next = N - next_start - 1;
      return doitfirst(it + 1, std::integral_constant<std::size_t, next>{}, std::integral_constant<bool, next_highest_power_of_two(next) - 1 == next>{});
    }
    else
      return doit_fast(first, std::integral_constant<std::size_t, next_start>{});
  }